

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

ProcMemObjCast jx9MemObjCastMethod(sxi32 iFlags)

{
  code *pcVar1;
  
  if ((iFlags & 1U) != 0) {
    return jx9MemObjToString;
  }
  if ((iFlags & 2U) != 0) {
    return jx9MemObjToInteger;
  }
  if ((iFlags & 4U) != 0) {
    return jx9MemObjToReal;
  }
  if ((iFlags & 8U) == 0) {
    pcVar1 = jx9MemObjToHashmap;
    if ((iFlags & 0x40U) == 0) {
      pcVar1 = jx9MemObjToNull;
    }
    return pcVar1;
  }
  return jx9MemObjToBool;
}

Assistant:

JX9_PRIVATE ProcMemObjCast jx9MemObjCastMethod(sxi32 iFlags)
{
	if( iFlags & MEMOBJ_STRING ){
		return jx9MemObjToString;
	}else if( iFlags & MEMOBJ_INT ){
		return jx9MemObjToInteger;
	}else if( iFlags & MEMOBJ_REAL ){
		return jx9MemObjToReal;
	}else if( iFlags & MEMOBJ_BOOL ){
		return jx9MemObjToBool;
	}else if( iFlags & MEMOBJ_HASHMAP ){
		return jx9MemObjToHashmap;
	}
	/* NULL cast */
	return jx9MemObjToNull;
}